

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall
leveldb::CorruptionTest_CompactionInputError_Test::~CorruptionTest_CompactionInputError_Test
          (CorruptionTest_CompactionInputError_Test *this)

{
  CorruptionTest::~CorruptionTest(&this->super_CorruptionTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CorruptionTest, CompactionInputError) {
  Build(10);
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  const int last = config::kMaxMemCompactLevel;
  ASSERT_EQ(1, Property("leveldb.num-files-at-level" + NumberToString(last)));

  Corrupt(kTableFile, 100, 1);
  Check(5, 9);

  // Force compactions by writing lots of values
  Build(10000);
  Check(10000, 10000);
}